

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O3

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  color_quad_u8 cVar6;
  undefined2 uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  uint *puVar19;
  uint *puVar20;
  bool bVar21;
  uint16 uVar22;
  uint i;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint32 uVar26;
  ulong uVar27;
  size_t sVar28;
  long lVar29;
  uint64 uVar30;
  undefined1 *puVar31;
  undefined8 uVar32;
  uint64 uVar33;
  uint uVar34;
  undefined4 uVar35;
  undefined8 uVar36;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  color_quad_u8 *pcVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  uchar *puVar46;
  long lVar47;
  ulong uVar48;
  undefined7 in_register_00000089;
  char cVar49;
  uint uVar50;
  size_t __n;
  uint i_3;
  uint uVar51;
  bool bVar52;
  undefined2 uVar106;
  float fVar53;
  undefined1 auVar62 [16];
  float fVar65;
  int iVar68;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined2 uVar107;
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM3_Ba;
  undefined1 uVar82;
  undefined1 in_XMM3_Bb;
  undefined1 uVar83;
  undefined1 in_XMM3_Bc;
  undefined1 uVar84;
  undefined1 in_XMM3_Bd;
  undefined1 uVar85;
  undefined1 in_XMM3_Be;
  undefined1 uVar86;
  undefined1 in_XMM3_Bf;
  undefined1 uVar87;
  undefined1 in_XMM3_Bg;
  undefined1 uVar88;
  undefined1 in_XMM3_Bh;
  undefined1 uVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  undefined1 auVar94 [16];
  byte bVar96;
  double dVar95;
  double dVar97;
  double dVar98;
  double dVar99;
  int iVar101;
  undefined1 auVar100 [16];
  double dVar102;
  double dVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int max [3];
  uint ave_color [3];
  uint c;
  vec3F scaled_principle_axis;
  vec3F initial_ofs;
  int min [3];
  vec3F probe_high_color;
  vec3F probe_low_color;
  uint probe_low [17];
  uint probe_high [17];
  byte local_238 [6];
  byte local_232;
  undefined1 local_231;
  undefined1 local_230;
  undefined1 local_22f;
  undefined1 local_22e;
  undefined1 local_22c;
  undefined1 local_22b;
  undefined1 local_22a;
  uint *local_228;
  bool local_21d;
  uint local_21c;
  uint *local_218;
  uchar *local_210;
  float local_204;
  undefined1 *local_200;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_1f8;
  uint local_1ec;
  undefined8 local_1e8;
  long lStack_1e0;
  long local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1b8 [2];
  uint local_1b0;
  uint local_1ac;
  size_t local_1a8;
  uint local_1a0 [4];
  undefined8 local_190;
  float local_188;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_180;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_17c;
  undefined8 local_178;
  float local_170;
  dxt1_block local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  uint8 *local_140;
  uint local_134;
  float local_130 [6];
  undefined8 local_118;
  undefined8 uStack_110;
  uint64 local_108;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_100;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_fc;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  double local_c8 [4];
  undefined1 local_a8 [48];
  double local_78 [9];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar64 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar54 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar80 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar81 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar71 [16];
  
  local_228 = low16;
  __n = (size_t)n;
  lVar47 = 0;
  pcVar42 = block;
  do {
    bVar96 = (block->field_0).c[lVar47];
    uVar27 = (ulong)bVar96;
    uVar45 = (uint)bVar96;
    uVar44 = (uint)bVar96;
    if (4 < n * 4) {
      uVar38 = 4;
      uVar39 = uVar27;
      uVar48 = uVar27;
      do {
        bVar96 = (pcVar42->field_0).c[uVar38];
        uVar27 = uVar27 + bVar96;
        uVar44 = (uint)bVar96;
        if ((uint)bVar96 <= (uint)uVar48) {
          uVar48 = (ulong)uVar44;
        }
        uVar45 = (uint)uVar48;
        if (uVar44 < (uint)uVar39) {
          uVar44 = (uint)uVar39;
        }
        uVar38 = uVar38 + 4;
        uVar39 = (ulong)uVar44;
      } while (uVar38 < n * 4);
    }
    local_1a0[lVar47] = (uint)((uVar27 + (n >> 1)) / __n);
    *(uint *)(local_168.m_low_color + lVar47 * 4) = uVar45;
    *(uint *)((long)&local_1e8 + lVar47 * 4) = uVar44;
    lVar47 = lVar47 + 1;
    pcVar42 = (color_quad_u8 *)((long)&pcVar42->field_0 + 1);
  } while (lVar47 != 3);
  local_1d0 = (ulong)n;
  if ((((uint)local_1e8 - local_168._0_4_ == 0) && (local_168.m_selectors == local_1e8._4_4_)) &&
     ((int)uStack_160 == (int)lStack_1e0)) {
    memset(pSelectors,2,__n);
    *local_228 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2] |
                 (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2] << 5 |
                 (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2] << 0xb;
    n = (uint)local_1d0;
    uVar50 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2 + 1] |
             (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2 + 1] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2 + 1] << 0xb;
    *high16 = uVar50;
  }
  else {
    local_a8._0_16_ = (undefined1  [16])0x0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[1] = 0.0;
    if (n == 0) {
      local_c8[0] = 0.0;
    }
    else {
      uVar39 = 0;
      uVar27 = CONCAT17(in_XMM3_Bh,
                        CONCAT16(in_XMM3_Bg,
                                 CONCAT15(in_XMM3_Bf,
                                          CONCAT14(in_XMM3_Be,
                                                   CONCAT13(in_XMM3_Bd,
                                                            CONCAT12(in_XMM3_Bc,
                                                                     CONCAT11(in_XMM3_Bb,in_XMM3_Ba)
                                                                    )))))) ^
               CONCAT17(in_XMM3_Bh,
                        CONCAT16(in_XMM3_Bg,
                                 CONCAT15(in_XMM3_Bf,
                                          CONCAT14(in_XMM3_Be,
                                                   CONCAT13(in_XMM3_Bd,
                                                            CONCAT12(in_XMM3_Bc,
                                                                     CONCAT11(in_XMM3_Bb,in_XMM3_Ba)
                                                                    ))))));
      uVar82 = (undefined1)uVar27;
      uVar83 = (undefined1)(uVar27 >> 8);
      uVar84 = (undefined1)(uVar27 >> 0x10);
      uVar85 = (undefined1)(uVar27 >> 0x18);
      uVar86 = (undefined1)(uVar27 >> 0x20);
      uVar87 = (undefined1)(uVar27 >> 0x28);
      uVar88 = (undefined1)(uVar27 >> 0x30);
      uVar89 = (undefined1)(uVar27 >> 0x38);
      dVar69 = 0.0;
      local_c8[3] = 0.0;
      local_a8._0_8_ = 0.0;
      local_a8._8_8_ = 0.0;
      local_c8[0] = 0.0;
      do {
        dVar92 = (double)(int)(block[uVar39].field_0.field_0.r - local_1a0[0]);
        uVar5 = *(undefined2 *)((long)&block[uVar39].field_0 + 1);
        bVar96 = (byte)((ushort)uVar5 >> 8);
        dVar95 = (double)(int)((CONCAT12(bVar96,uVar5) & 0xff) - local_1a0[1]);
        dVar97 = (double)(int)(bVar96 - local_1a0[2]);
        local_c8[1] = (double)CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,
                                                  CONCAT13(uVar85,CONCAT12(uVar84,CONCAT11(uVar83,
                                                  uVar82))))))) + dVar92 * dVar95;
        uVar82 = SUB81(local_c8[1],0);
        uVar83 = (undefined1)((ulong)local_c8[1] >> 8);
        uVar84 = (undefined1)((ulong)local_c8[1] >> 0x10);
        uVar85 = (undefined1)((ulong)local_c8[1] >> 0x18);
        uVar86 = (undefined1)((ulong)local_c8[1] >> 0x20);
        uVar87 = (undefined1)((ulong)local_c8[1] >> 0x28);
        uVar88 = (undefined1)((ulong)local_c8[1] >> 0x30);
        uVar89 = (undefined1)((ulong)local_c8[1] >> 0x38);
        dVar69 = dVar69 + dVar92 * dVar97;
        local_c8[3] = local_c8[3] + dVar95 * dVar95;
        local_a8._0_8_ = (double)local_a8._0_8_ + dVar95 * dVar97;
        local_a8._8_8_ = (double)local_a8._8_8_ + dVar97 * dVar97;
        local_c8[0] = local_c8[0] + dVar92 * dVar92;
        uVar39 = uVar39 + 1;
      } while (__n != uVar39);
      auVar94._8_4_ = SUB84(dVar69,0);
      auVar94._0_8_ = local_c8[1];
      auVar94._12_4_ = (int)((ulong)dVar69 >> 0x20);
      local_c8[2] = auVar94._8_8_;
    }
    lVar47 = 0;
    do {
      dVar69 = local_c8[lVar47 + 1];
      local_78[lVar47] = local_c8[lVar47] * 0.003921568859368563;
      local_78[lVar47 + 1] = dVar69 * 0.003921568859368563;
      lVar47 = lVar47 + 2;
    } while (lVar47 != 6);
    dVar95 = (double)((int)local_1e8._4_4_ - (int)local_168.m_selectors);
    dVar92 = (double)((int)lStack_1e0 - (int)uStack_160);
    iVar23 = 4;
    dVar69 = (double)(int)((uint)local_1e8 - local_168._0_4_);
    do {
      dVar102 = local_78[4] * dVar95;
      dVar97 = dVar92 * local_78[2] + dVar69 * local_78[0] + dVar95 * local_78[1];
      dVar95 = dVar92 * local_78[4] + dVar69 * local_78[1] + dVar95 * local_78[3];
      dVar92 = dVar92 * local_78[5] + dVar69 * local_78[2] + dVar102;
      iVar23 = iVar23 + -1;
      dVar69 = dVar97;
    } while (iVar23 != 0);
    dVar102 = ABS(dVar95);
    uVar82 = SUB81(dVar102,0);
    uVar83 = (undefined1)((ulong)dVar102 >> 8);
    uVar84 = (undefined1)((ulong)dVar102 >> 0x10);
    uVar85 = (undefined1)((ulong)dVar102 >> 0x18);
    uVar86 = (undefined1)((ulong)dVar102 >> 0x20);
    uVar87 = (undefined1)((ulong)dVar102 >> 0x28);
    uVar88 = (undefined1)((ulong)dVar102 >> 0x30);
    uVar89 = (undefined1)((ulong)dVar102 >> 0x38);
    dVar69 = ABS(dVar97);
    if (ABS(dVar97) <= dVar102) {
      dVar69 = dVar102;
    }
    if (dVar69 <= ABS(dVar92)) {
      dVar69 = ABS(dVar92);
    }
    if (4.0 <= dVar69) {
      dVar69 = 512.0 / dVar69;
      iVar101 = (int)(dVar97 * dVar69);
      iVar68 = (int)(dVar95 * dVar69);
      iVar23 = (int)(dVar92 * dVar69);
      local_118 = (uchar *)CONCAT44((float)(dVar95 * dVar69),(float)(dVar97 * dVar69));
      local_204 = (float)(dVar92 * dVar69);
    }
    else {
      iVar101 = 0x94;
      iVar68 = 300;
      local_118 = (uchar *)0x4396000043140000;
      iVar23 = 0x3a;
      local_204 = 58.0;
    }
    uStack_110 = 0;
    local_21c = (uint)CONCAT71(in_register_00000089,refine);
    bVar96 = (block->field_0).field_0.r;
    bVar2 = (block->field_0).field_0.g;
    uVar34 = (uint)bVar96;
    bVar3 = (block->field_0).field_0.b;
    uVar44 = (uint)bVar2;
    uVar40 = (uint)bVar3;
    uVar45 = uVar34;
    uVar25 = uVar44;
    if (1 < n) {
      iVar41 = uVar40 * iVar23 + uVar34 * iVar101 + uVar44 * iVar68;
      lVar47 = 0;
      local_1c8[0] = bVar96;
      local_200 = (undefined1 *)CONCAT71(local_200._1_7_,bVar96);
      local_1f8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                  CONCAT71(local_1f8._1_7_,bVar2);
      local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar3);
      uVar44 = (uint)bVar2;
      iVar43 = iVar41;
      do {
        bVar96 = block[lVar47 + 1].field_0.field_0.r;
        bVar2 = block[lVar47 + 1].field_0.field_0.g;
        bVar4 = block[lVar47 + 1].field_0.field_0.b;
        iVar24 = (uint)bVar4 * iVar23 + (uint)bVar2 * iVar68 + (uint)bVar96 * iVar101;
        if (iVar24 < iVar43) {
          local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar4);
          local_1f8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                      CONCAT71(local_1f8._1_7_,bVar2);
          local_200 = (undefined1 *)CONCAT71(local_200._1_7_,bVar96);
          iVar43 = iVar24;
        }
        if (iVar41 < iVar24) {
          local_1c8[0] = bVar96;
          iVar41 = iVar24;
          uVar44 = (uint)bVar2;
          bVar3 = bVar4;
        }
        lVar47 = lVar47 + 1;
      } while (__n - 1 != lVar47);
      uVar34 = (uint)local_1c8[0];
      uVar40 = (uint)(byte)local_210;
      uVar45 = (uint)(byte)local_200;
      uVar25 = (uint)(byte)local_1f8;
    }
    *low16 = (((uint)bVar3 * 0x1f + 0x80 >> 8) + (uint)bVar3 * 0x1f + 0x80 >> 8) +
             (uVar44 * 0x3f + (uVar44 * 0x3f + 0x80 >> 8) + 0x80 >> 3 & 0x1fe0) +
             ((uVar34 * 0x1f + 0x80 >> 8) + uVar34 * 0x1f + 0x80 & 0x7f00) * 8;
    uVar50 = ((uVar40 * 0x1f + 0x80 >> 8) + uVar40 * 0x1f + 0x80 >> 8) +
             ((uVar25 * 0x3f + 0x80 >> 8) + uVar25 * 0x3f + 0x80 >> 3 & 0x1fe0) +
             (uVar45 * 0x1f + (uVar45 * 0x1f + 0x80 >> 8) + 0x80 & 0x7f00) * 8;
    *high16 = uVar50;
    local_218 = high16;
    local_1a8 = __n;
    bVar21 = determine_selectors(n,block,*low16,uVar50,pSelectors);
    __n = local_1a8;
    if (bVar21) {
      if (n == 0) {
        dVar97 = 0.0;
        dVar102 = 0.0;
        dVar92 = 0.0;
        dVar93 = 0.0;
        dVar95 = 0.0;
        uVar27 = CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,CONCAT13(uVar85,
                                                  CONCAT12(uVar84,CONCAT11(uVar83,uVar82))))))) ^
                 CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,CONCAT13(uVar85,
                                                  CONCAT12(uVar84,CONCAT11(uVar83,uVar82)))))));
        uVar82 = (undefined1)uVar27;
        uVar83 = (undefined1)(uVar27 >> 8);
        uVar84 = (undefined1)(uVar27 >> 0x10);
        uVar85 = (undefined1)(uVar27 >> 0x18);
        uVar86 = (undefined1)(uVar27 >> 0x20);
        uVar87 = (undefined1)(uVar27 >> 0x28);
        uVar88 = (undefined1)(uVar27 >> 0x30);
        uVar89 = (undefined1)(uVar27 >> 0x38);
        dVar69 = 0.0;
        dVar90 = 0.0;
        dVar91 = 0.0;
      }
      else {
        dVar95 = 0.0;
        sVar28 = 0;
        dVar93 = 0.0;
        dVar92 = 0.0;
        dVar97 = 0.0;
        dVar102 = 0.0;
        uVar27 = CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,CONCAT13(uVar85,
                                                  CONCAT12(uVar84,CONCAT11(uVar83,uVar82))))))) ^
                 CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,CONCAT13(uVar85,
                                                  CONCAT12(uVar84,CONCAT11(uVar83,uVar82)))))));
        uVar82 = (undefined1)uVar27;
        uVar83 = (undefined1)(uVar27 >> 8);
        uVar84 = (undefined1)(uVar27 >> 0x10);
        uVar85 = (undefined1)(uVar27 >> 0x18);
        uVar86 = (undefined1)(uVar27 >> 0x20);
        uVar87 = (undefined1)(uVar27 >> 0x28);
        uVar88 = (undefined1)(uVar27 >> 0x30);
        uVar89 = (undefined1)(uVar27 >> 0x38);
        dVar69 = 0.0;
        dVar90 = 0.0;
        dVar91 = 0.0;
        do {
          cVar6.field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                &block[sVar28].field_0.field_0;
          uVar27 = (ulong)cVar6.field_0._0_2_ & 0xffffffffffff00ff;
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar27;
          auVar8[0xc] = cVar6.field_0._3_1_;
          auVar9[8] = cVar6.field_0._2_1_;
          auVar9._0_8_ = uVar27;
          auVar9[9] = 0;
          auVar9._10_3_ = auVar8._10_3_;
          auVar11._5_8_ = 0;
          auVar11._0_5_ = auVar9._8_5_;
          auVar10[4] = cVar6.field_0._1_1_;
          auVar10._0_4_ = (int)uVar27;
          auVar10[5] = 0;
          auVar10._6_7_ = SUB137(auVar11 << 0x40,6);
          dVar98 = (double)(int)uVar27;
          dVar99 = (double)block[sVar28].field_0.field_0.b;
          bVar96 = pSelectors[sVar28];
          dVar90 = dVar90 + (double)dxt1_endpoint_optimizer::refine_solution::prods_1[bVar96];
          dVar91 = dVar91 + (double)dxt1_endpoint_optimizer::refine_solution::prods_0[bVar96];
          dVar95 = dVar95 + (double)dxt1_endpoint_optimizer::refine_solution::prods_2[bVar96];
          dVar103 = (double)dxt1_endpoint_optimizer::refine_solution::w1Tab[bVar96];
          dVar97 = dVar97 + dVar103 * dVar98;
          dVar102 = dVar102 + dVar103 * (double)auVar10._4_4_;
          dVar93 = dVar93 + dVar103 * dVar99;
          dVar98 = (double)CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,CONCAT13(
                                                  uVar85,CONCAT12(uVar84,CONCAT11(uVar83,uVar82)))))
                                                  )) + dVar98;
          uVar82 = SUB81(dVar98,0);
          uVar83 = (undefined1)((ulong)dVar98 >> 8);
          uVar84 = (undefined1)((ulong)dVar98 >> 0x10);
          uVar85 = (undefined1)((ulong)dVar98 >> 0x18);
          uVar86 = (undefined1)((ulong)dVar98 >> 0x20);
          uVar87 = (undefined1)((ulong)dVar98 >> 0x28);
          uVar88 = (undefined1)((ulong)dVar98 >> 0x30);
          uVar89 = (undefined1)((ulong)dVar98 >> 0x38);
          dVar69 = dVar69 + (double)auVar10._4_4_;
          dVar92 = dVar92 + dVar99;
          sVar28 = sVar28 + 1;
        } while (local_1a8 != sVar28);
      }
      cVar49 = (char)local_21c;
      uVar50 = *high16;
      if ((((dVar90 != 0.0) || (NAN(dVar90))) && ((dVar95 != 0.0 || (NAN(dVar95))))) &&
         (dVar98 = dVar95 * dVar90 - dVar91 * dVar91, 1.249999968422344e-05 <= ABS(dVar98))) {
        dVar99 = dVar92 * 3.0 - dVar93;
        dVar98 = 0.364705890417099 / dVar98;
        uVar51 = *local_228;
        dVar92 = (double)CONCAT17(uVar89,CONCAT16(uVar88,CONCAT15(uVar87,CONCAT14(uVar86,CONCAT13(
                                                  uVar85,CONCAT12(uVar84,CONCAT11(uVar83,uVar82)))))
                                                 )) * 3.0 - dVar97;
        dVar69 = dVar69 * 3.0 - dVar102;
        iVar23 = (int)((dVar90 * dVar97 - dVar91 * dVar92) * dVar98 + 0.5);
        iVar101 = (int)((dVar90 * dVar102 - dVar91 * dVar69) * dVar98 * 2.0322580337524414 + 0.5);
        auVar94 = ZEXT816(0x3f0000001f);
        auVar104._0_8_ = CONCAT44(-(uint)(iVar101 < auVar94._4_4_),-(uint)(iVar23 < auVar94._0_4_));
        auVar104._8_8_ = 0;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = CONCAT44(iVar101,iVar23) & auVar104._0_8_;
        auVar100 = ~auVar104 & auVar94 | auVar100;
        auVar105._0_4_ = -(uint)(0 < auVar100._0_4_);
        auVar105._4_4_ = -(uint)(0 < auVar100._4_4_);
        auVar105._8_4_ = -(uint)(0 < auVar100._8_4_);
        auVar105._12_4_ = -(uint)(0 < auVar100._12_4_);
        uVar44 = (uint)((dVar90 * dVar93 - dVar91 * dVar99) * dVar98 + 0.5);
        if (0x1e < (int)uVar44) {
          uVar44 = 0x1f;
        }
        if ((int)uVar44 < 1) {
          uVar44 = 0;
        }
        *local_228 = SUB164(auVar105 & auVar100,4) * 0x20 |
                     SUB164(auVar105 & auVar100,0) << 0xb | uVar44;
        iVar23 = (int)((dVar95 * dVar92 - dVar91 * dVar97) * dVar98 + 0.5);
        iVar101 = (int)((dVar95 * dVar69 - dVar91 * dVar102) * dVar98 * 2.0322580337524414 + 0.5);
        auVar70._0_8_ = CONCAT44(-(uint)(iVar101 < auVar94._4_4_),-(uint)(iVar23 < auVar94._0_4_));
        auVar70._8_8_ = 0;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = CONCAT44(iVar101,iVar23) & auVar70._0_8_;
        auVar66 = ~auVar70 & auVar94 | auVar66;
        auVar67._0_4_ = -(uint)(0 < auVar66._0_4_);
        auVar67._4_4_ = -(uint)(0 < auVar66._4_4_);
        auVar67._8_4_ = -(uint)(0 < auVar66._8_4_);
        auVar67._12_4_ = -(uint)(0 < auVar66._12_4_);
        uVar45 = (uint)((dVar99 * dVar95 - dVar93 * dVar91) * dVar98 + 0.5);
        uVar44 = 0x1f;
        if ((int)uVar45 < 0x1f) {
          uVar44 = uVar45;
        }
        if ((int)uVar44 < 1) {
          uVar44 = 0;
        }
        uVar44 = SUB164(auVar67 & auVar66,4) << 5 | SUB164(auVar67 & auVar66,0) << 0xb | uVar44;
        *high16 = uVar44;
        if ((uVar50 != uVar44) || (uVar51 != *local_228)) {
          determine_selectors(n,block,*local_228,uVar44,pSelectors);
          uVar50 = *high16;
        }
      }
      if (cVar49 != '\0') {
        uVar51 = *local_228;
        local_108 = determine_error(n,block,uVar51,uVar50,0xffffffffffffffff);
        if (local_108 != 0) {
          uVar86 = 0;
          uVar87 = 0;
          uVar88 = 0;
          uVar89 = 0;
          fVar65 = 1.0 / SQRT(local_204 * local_204 +
                              (float)local_118 * (float)local_118 +
                              local_118._4_4_ * local_118._4_4_);
          local_d0 = local_204 * fVar65;
          uVar82 = SUB41(local_d0,0);
          uVar83 = (undefined1)((uint)local_d0 >> 8);
          uVar84 = (undefined1)((uint)local_d0 >> 0x10);
          uVar85 = (undefined1)((uint)local_d0 >> 0x18);
          local_d8 = CONCAT44(fVar65 * local_118._4_4_,fVar65 * (float)local_118);
          lVar47 = 0;
          do {
            *(float *)((long)&local_190 + lVar47 * 4) =
                 *(float *)((long)&local_d8 + lVar47 * 4) * 0.027063293;
            lVar47 = lVar47 + 1;
          } while (lVar47 != 3);
          local_190 = CONCAT44((float)((ulong)local_190 >> 0x20) * 63.0,(float)local_190 * 31.0);
          local_188 = local_188 * 31.0;
          lVar47 = 0;
          do {
            *(float *)((long)&local_178 + lVar47 * 4) =
                 *(float *)((long)&local_190 + lVar47 * 4) * -8.0;
            lVar47 = lVar47 + 1;
          } while (lVar47 != 3);
          local_178 = CONCAT44((float)((ulong)local_178 >> 0x20) + 0.5,(float)local_178 + 0.5);
          local_170 = local_170 + 0.5;
          local_1ec = 0;
          local_140 = pSelectors;
          do {
            dxt1_block::unpack_color(&local_168,(uint16)uVar51,false,0xff);
            uVar25 = (uint)local_168.m_high_color[0];
            local_1c8 = ZEXT416((uint)local_168._0_4_);
            dxt1_block::unpack_color(&local_168,(uint16)*high16,false,0xff);
            uVar44 = CONCAT13(uVar85,CONCAT12(uVar84,CONCAT11(uVar83,uVar82))) ^
                     CONCAT13(uVar85,CONCAT12(uVar84,CONCAT11(uVar83,uVar82)));
            uVar82 = (undefined1)uVar44;
            uVar83 = (undefined1)(uVar44 >> 8);
            uVar84 = (undefined1)(uVar44 >> 0x10);
            uVar85 = (undefined1)(uVar44 >> 0x18);
            uVar45 = CONCAT13(uVar89,CONCAT12(uVar88,CONCAT11(uVar87,uVar86))) ^
                     CONCAT13(uVar89,CONCAT12(uVar88,CONCAT11(uVar87,uVar86)));
            uVar86 = (undefined1)uVar45;
            uVar87 = (undefined1)(uVar45 >> 8);
            uVar88 = (undefined1)(uVar45 >> 0x10);
            uVar89 = (undefined1)(uVar45 >> 0x18);
            auVar61._0_14_ = local_1c8._0_14_;
            auVar61[0xe] = local_1c8[7];
            auVar61[0xf] = uVar89;
            auVar60._14_2_ = auVar61._14_2_;
            auVar60._0_13_ = local_1c8._0_13_;
            auVar60[0xd] = uVar88;
            auVar59._13_3_ = auVar60._13_3_;
            auVar59._0_12_ = local_1c8._0_12_;
            auVar59[0xc] = local_1c8[6];
            auVar58._12_4_ = auVar59._12_4_;
            auVar58._0_11_ = local_1c8._0_11_;
            auVar58[0xb] = uVar87;
            auVar57._11_5_ = auVar58._11_5_;
            auVar57._0_10_ = local_1c8._0_10_;
            auVar57[10] = local_1c8[5];
            auVar56._10_6_ = auVar57._10_6_;
            auVar56._0_9_ = local_1c8._0_9_;
            auVar56[9] = uVar86;
            auVar55._9_7_ = auVar56._9_7_;
            auVar55._0_8_ = local_1c8._0_8_;
            auVar55[8] = local_1c8[4];
            Var14 = CONCAT91(CONCAT81(auVar55._8_8_,uVar85),local_1c8[3]);
            auVar13._2_10_ = Var14;
            auVar13[1] = uVar84;
            auVar13[0] = local_1c8[2];
            auVar12._2_12_ = auVar13;
            auVar12[1] = uVar83;
            auVar12[0] = local_1c8[1];
            uVar106 = CONCAT11(uVar82,local_1c8[0]);
            auVar54._2_14_ = auVar12;
            uVar7 = (undefined2)(uVar45 >> 0x10);
            auVar64._0_12_ = auVar54._0_12_;
            auVar64._12_2_ = (short)Var14;
            auVar64._14_2_ = uVar7;
            auVar63._12_4_ = auVar64._12_4_;
            auVar63._0_10_ = auVar54._0_10_;
            auVar63._10_2_ = (short)uVar45;
            auVar62._10_6_ = auVar63._10_6_;
            auVar62._0_8_ = auVar54._0_8_;
            auVar62._8_2_ = auVar13._0_2_;
            uVar5 = (undefined2)(uVar44 >> 0x10);
            auVar15._4_8_ = auVar62._8_8_;
            auVar15._2_2_ = uVar5;
            auVar15._0_2_ = auVar12._0_2_;
            local_e8 = CONCAT44((float)auVar15._0_4_,(float)CONCAT22((short)uVar44,uVar106));
            local_e0 = (float)uVar25;
            auVar78._0_15_ = ZEXT415(0);
            auVar78[0xf] = uVar89;
            auVar77._14_2_ = auVar78._14_2_;
            auVar77._0_13_ = ZEXT413(0);
            auVar77[0xd] = uVar88;
            auVar76._13_3_ = auVar77._13_3_;
            auVar76._0_13_ = ZEXT413(0);
            auVar75._12_4_ = auVar76._12_4_;
            auVar75._0_11_ = ZEXT411(0);
            auVar75[0xb] = uVar87;
            auVar74._11_5_ = auVar75._11_5_;
            auVar74._0_11_ = ZEXT411(0);
            auVar73._10_6_ = auVar74._10_6_;
            auVar73._0_9_ = (unkuint9)0;
            auVar73[9] = uVar86;
            auVar72._9_7_ = auVar73._9_7_;
            auVar72._0_9_ = (unkuint9)0;
            Var14 = CONCAT91(CONCAT81(auVar72._8_8_,uVar85),local_168.m_high_color[1]);
            auVar18._2_10_ = Var14;
            auVar18[1] = uVar84;
            auVar18[0] = local_168.m_high_color[0];
            auVar16._2_12_ = auVar18;
            auVar16[1] = uVar83;
            auVar16[0] = local_168.m_low_color[1];
            uVar107 = CONCAT11(uVar82,local_168.m_low_color[0]);
            auVar71._2_14_ = auVar16;
            auVar81._0_12_ = auVar71._0_12_;
            auVar81._12_2_ = (short)Var14;
            auVar81._14_2_ = uVar7;
            auVar80._12_4_ = auVar81._12_4_;
            auVar80._0_10_ = auVar71._0_10_;
            auVar80._10_2_ = (short)uVar45;
            auVar79._10_6_ = auVar80._10_6_;
            auVar79._0_8_ = auVar71._0_8_;
            auVar79._8_2_ = auVar18._0_2_;
            auVar17._4_8_ = auVar79._8_8_;
            auVar17._2_2_ = uVar5;
            auVar17._0_2_ = auVar16._0_2_;
            local_f8 = CONCAT44((float)auVar17._0_4_,(float)CONCAT22((short)uVar44,uVar107));
            local_f0 = (float)local_168.m_high_color[0];
            lVar47 = 0;
            do {
              local_130[lVar47 + 3] =
                   *(float *)((long)&local_e8 + lVar47 * 4) +
                   *(float *)((long)&local_178 + lVar47 * 4);
              lVar47 = lVar47 + 1;
            } while (lVar47 != 3);
            lVar47 = 0;
            do {
              fVar65 = local_130[4];
              fVar53 = floorf(local_130[3]);
              iVar23 = (int)fVar53;
              if (0x1e < iVar23) {
                iVar23 = 0x1f;
              }
              if (iVar23 < 1) {
                iVar23 = 0;
              }
              fVar65 = floorf(fVar65);
              iVar101 = (int)fVar65;
              if (0x3e < iVar101) {
                iVar101 = 0x3f;
              }
              if (iVar101 < 1) {
                iVar101 = 0;
              }
              fVar65 = floorf(local_130[5]);
              uVar44 = (uint)fVar65;
              if (0x1e < (int)uVar44) {
                uVar44 = 0x1f;
              }
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              *(uint *)((long)local_c8 + lVar47 * 4) = iVar23 << 0xb | iVar101 << 5 | uVar44;
              lVar29 = 0;
              do {
                local_130[lVar29 + 3] =
                     *(float *)((long)&local_190 + lVar29 * 4) + local_130[lVar29 + 3];
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x11);
            lVar47 = 0;
            do {
              local_130[lVar47] =
                   *(float *)((long)&local_f8 + lVar47 * 4) +
                   *(float *)((long)&local_178 + lVar47 * 4);
              lVar47 = lVar47 + 1;
            } while (lVar47 != 3);
            lVar47 = 0;
            do {
              fVar65 = local_130[1];
              fVar53 = floorf(local_130[0]);
              iVar23 = (int)fVar53;
              if (0x1e < iVar23) {
                iVar23 = 0x1f;
              }
              if (iVar23 < 1) {
                iVar23 = 0;
              }
              fVar65 = floorf(fVar65);
              iVar101 = (int)fVar65;
              if (0x3e < iVar101) {
                iVar101 = 0x3f;
              }
              if (iVar101 < 1) {
                iVar101 = 0;
              }
              fVar65 = floorf(local_130[2]);
              uVar44 = (uint)fVar65;
              if (0x1e < (int)uVar44) {
                uVar44 = 0x1f;
              }
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              *(uint *)((long)local_78 + lVar47 * 4) = iVar23 << 0xb | iVar101 << 5 | uVar44;
              lVar29 = 0;
              do {
                local_130[lVar29] = *(float *)((long)&local_190 + lVar29 * 4) + local_130[lVar29];
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x11);
            local_158 = 0;
            uStack_150 = 0;
            local_168.m_low_color[0] = '\0';
            local_168.m_low_color[1] = '\0';
            local_168.m_high_color[0] = '\0';
            local_168.m_high_color[1] = '\0';
            local_168.m_selectors[0] = '\0';
            local_168.m_selectors[1] = '\0';
            local_168.m_selectors[2] = '\0';
            local_168.m_selectors[3] = '\0';
            uStack_160 = 0;
            local_1c8._0_4_ = *local_218;
            local_210 = (uchar *)CONCAT44(local_210._4_4_,*local_228);
            local_1a0[3] = *local_218 << 0x10 | *local_228;
            local_1a0[3] = fast_hash(local_1a0 + 3,4);
            *(long *)(local_168.m_low_color + (local_1a0[3] >> 3 & 0x18)) =
                 1L << ((byte)local_1a0[3] & 0x3f);
            puVar31 = (undefined1 *)0x0;
            do {
              local_200 = puVar31;
              uVar44 = *(uint *)((long)local_c8 + (long)puVar31 * 4);
              lVar47 = 0;
              do {
                uVar45 = *(uint *)((long)local_78 + lVar47 * 4);
                uVar25 = uVar45;
                if (uVar44 >= uVar45 && uVar44 != uVar45) {
                  uVar25 = uVar44;
                }
                if (uVar44 < uVar45) {
                  uVar45 = uVar44;
                }
                local_1e8._0_4_ = uVar45 << 0x10 | uVar25;
                uVar26 = fast_hash(&local_1e8,4);
                local_1e8 = CONCAT44(local_1e8._4_4_,uVar26);
                uVar34 = uVar26 >> 6 & 3;
                if (((ulong)(&local_168)[uVar34] >> ((ulong)uVar26 & 0x3f) & 1) == 0) {
                  (&local_168)[uVar34] =
                       (dxt1_block)(1L << ((byte)uVar26 & 0x3f) | (ulong)(&local_168)[uVar34]);
                  uVar33 = local_108;
                  local_1f8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                              CONCAT44(local_1f8._4_4_,uVar45);
                  uVar30 = determine_error((uint)local_1d0,block,uVar25,uVar45,local_108);
                  bVar21 = uVar30 < uVar33;
                  uVar45 = (uint)local_210;
                  if (bVar21) {
                    uVar45 = uVar25;
                  }
                  local_210 = (uchar *)CONCAT44(local_210._4_4_,uVar45);
                  uVar35 = local_1c8._0_4_;
                  if (bVar21) {
                    uVar35 = local_1f8._0_4_;
                  }
                  local_1c8._0_4_ = uVar35;
                  if (bVar21) {
                    uVar33 = uVar30;
                  }
                  local_108 = uVar33;
                }
                uVar27 = local_1d0;
                lVar47 = lVar47 + 1;
              } while (lVar47 != 0x11);
              puVar31 = local_200 + 1;
            } while (puVar31 != (undefined1 *)0x11);
            uVar39 = (ulong)(uint)local_1c8._0_4_;
            local_21d = *local_218 != local_1c8._0_4_ || *local_228 != (uint)local_210;
            if (*local_218 != local_1c8._0_4_ || *local_228 != (uint)local_210) {
              *local_228 = (uint)local_210;
              *local_218 = local_1c8._0_4_;
              determine_selectors((uint)local_1d0,block,*local_228,local_1c8._0_4_,pSelectors);
            }
            uVar36 = CONCAT71((int7)(uVar39 >> 8),1);
            uVar32 = 0;
            do {
              puVar20 = local_218;
              local_204 = (float)uVar36;
              local_134 = (uint)uVar32;
              uVar44 = *local_228;
              uVar45 = *local_218;
              local_238[0] = ryg_dxt::Expand5[uVar44 >> 0xb & 0x1f];
              local_238[1] = ryg_dxt::Expand6[uVar44 >> 5 & 0x3f];
              local_238[2] = ryg_dxt::Expand5[uVar44 & 0x1f];
              local_238[4] = ryg_dxt::Expand5[uVar45 >> 0xb & 0x1f];
              local_238[5] = ryg_dxt::Expand6[uVar45 >> 5 & 0x3f];
              local_232 = ryg_dxt::Expand5[uVar45 & 0x1f];
              local_238[3] = 0;
              local_231 = 0;
              local_230 = (char)(((uint)local_238[4] + (uint)local_238[0] * 2) / 3);
              local_22f = (char)(((uint)local_238[5] + (uint)local_238[1] * 2) / 3);
              local_22e = (char)(((uint)local_232 + (uint)local_238[2] * 2) / 3);
              local_22c = (char)(((uint)local_238[0] + (uint)local_238[4] * 2) / 3);
              local_22b = (char)(((uint)local_238[1] + (uint)local_238[5] * 2) / 3);
              local_22a = (char)(((uint)local_238[2] + (uint)local_232 * 2) / 3);
              local_1e8 = 0;
              lStack_1e0 = 0;
              local_1d8 = 0;
              if ((int)uVar27 == 0) {
                local_1e8 = 0;
              }
              else {
                uVar39 = 0;
                local_1d8 = 0;
                lStack_1e0 = 0;
                local_1e8 = 0;
                do {
                  uVar48 = (ulong)pSelectors[uVar39];
                  iVar23 = (uint)block[uVar39].field_0.field_0.r - (uint)local_238[uVar48 * 4];
                  local_1e8 = local_1e8 + (ulong)(uint)(iVar23 * iVar23);
                  iVar23 = (uint)block[uVar39].field_0.field_0.g - (uint)local_238[uVar48 * 4 + 1];
                  lStack_1e0 = lStack_1e0 + (ulong)(uint)(iVar23 * iVar23);
                  iVar23 = (uint)block[uVar39].field_0.field_0.b - (uint)local_238[uVar48 * 4 + 2];
                  local_1d8 = local_1d8 + (ulong)(uint)(iVar23 * iVar23);
                  uVar39 = uVar39 + 1;
                } while (__n != uVar39);
              }
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)uVar44,false,0xff);
              local_180 = local_1b8[0];
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)*puVar20,false,0xff);
              local_17c = local_1b8[0];
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)*local_228,true,0xff);
              local_100 = local_1b8[0];
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)*puVar20,true,0xff);
              lVar47 = 0;
              local_fc = local_1b8[0];
              uVar32 = 0;
              bVar21 = false;
              pcVar42 = block;
              do {
                if ((&local_1e8)[lVar47] != 0) {
                  local_200 = ryg_dxt::Expand5;
                  if (lVar47 == 1) {
                    local_200 = ryg_dxt::Expand6;
                  }
                  local_118 = local_100.c + lVar47;
                  puVar46 = local_180.c + lVar47;
                  local_21c = (uint)CONCAT71((int7)((ulong)(local_100.c + lVar47) >> 8),1);
                  local_1f8 = local_1b8;
                  lVar29 = 0;
                  local_1c8._0_8_ = lVar47;
                  local_210 = puVar46;
                  do {
                    uVar39 = lVar29 * 4 ^ 4;
                    *(uint *)((long)local_1b8 + uVar39) = (uint)local_118[uVar39];
                    iVar23 = -1;
                    do {
                      uVar44 = (uint)puVar46[lVar29 * 4] + iVar23;
                      if ((-1 < (int)uVar44) && ((int)uVar44 <= (int)(&DAT_001b06a0)[lVar47])) {
                        bVar96 = local_200[uVar44];
                        aVar37.m_u32._1_3_ = 0;
                        aVar37.field_0.r = bVar96;
                        *local_1f8 = aVar37;
                        local_1b0 = (local_1b8[1].m_u32 + local_1b8[0].m_u32 * 2) / 3;
                        local_1ac = (local_1b8[0].m_u32 + local_1b8[1].m_u32 * 2) / 3;
                        puVar1 = &local_1e8 + lVar47;
                        if ((int)uVar27 == 0) {
                          uVar39 = 0;
                        }
                        else {
                          uVar39 = 0;
                          uVar48 = 1;
                          do {
                            iVar101 = local_1b8[pSelectors[uVar48 - 1]].m_u32 -
                                      (uint)pcVar42[uVar48 - 1].field_0.field_0.r;
                            uVar39 = (uint)(iVar101 * iVar101) + uVar39;
                            if (*puVar1 <= uVar39) break;
                            bVar52 = uVar48 < __n;
                            uVar48 = uVar48 + 1;
                          } while (bVar52);
                        }
                        puVar46 = local_210;
                        lVar47 = local_1c8._0_8_;
                        if (uVar39 < *puVar1) {
                          local_210[lVar29 * 4] = (uchar)uVar44;
                          local_118[lVar29 * 4] = bVar96;
                          if ((local_21c & 1) == 0) {
                            uVar22 = dxt1_block::pack_color
                                               ((color_quad_u8 *)&local_17c.field_0,false,0x7f);
                            uVar44 = (uint)uVar22;
                            *local_218 = uVar44;
                            uVar50 = *local_228;
                          }
                          else {
                            uVar22 = dxt1_block::pack_color
                                               ((color_quad_u8 *)&local_180.field_0,false,0x7f);
                            uVar50 = (uint)uVar22;
                            *local_228 = (uint)uVar22;
                            uVar44 = *local_218;
                          }
                          uVar27 = local_1d0;
                          puVar20 = local_218;
                          puVar19 = local_228;
                          uVar51 = (uint)local_1d0;
                          determine_selectors(uVar51,block,uVar50,uVar44,local_140);
                          uVar44 = *puVar19;
                          uVar45 = *puVar20;
                          local_238[0] = ryg_dxt::Expand5[uVar44 >> 0xb & 0x1f];
                          local_238[1] = ryg_dxt::Expand6[uVar44 >> 5 & 0x3f];
                          local_238[2] = ryg_dxt::Expand5[uVar44 & 0x1f];
                          local_238[4] = ryg_dxt::Expand5[uVar45 >> 0xb & 0x1f];
                          local_238[5] = ryg_dxt::Expand6[uVar45 >> 5 & 0x3f];
                          local_232 = ryg_dxt::Expand5[uVar45 & 0x1f];
                          local_230 = (char)(((uint)local_238[4] + (uint)local_238[0] * 2) / 3);
                          local_22f = (char)(((uint)local_238[5] + (uint)local_238[1] * 2) / 3);
                          local_22e = (char)(((uint)local_232 + (uint)local_238[2] * 2) / 3);
                          local_22c = (char)(((uint)local_238[0] + (uint)local_238[4] * 2) / 3);
                          local_22b = (char)(((uint)local_238[1] + (uint)local_238[5] * 2) / 3);
                          local_22a = (char)(((uint)local_238[2] + (uint)local_232 * 2) / 3);
                          local_1e8 = 0;
                          lStack_1e0 = 0;
                          local_1d8 = 0;
                          if (uVar51 == 0) {
                            local_1e8 = 0;
                          }
                          else {
                            uVar39 = 0;
                            local_1d8 = 0;
                            lStack_1e0 = 0;
                            local_1e8 = 0;
                            do {
                              uVar48 = (ulong)local_140[uVar39];
                              iVar101 = (uint)block[uVar39].field_0.field_0.r -
                                        (uint)local_238[uVar48 * 4];
                              local_1e8 = local_1e8 + (ulong)(uint)(iVar101 * iVar101);
                              iVar101 = (uint)block[uVar39].field_0.field_0.g -
                                        (uint)local_238[uVar48 * 4 + 1];
                              lStack_1e0 = lStack_1e0 + (ulong)(uint)(iVar101 * iVar101);
                              iVar101 = (uint)block[uVar39].field_0.field_0.b -
                                        (uint)local_238[uVar48 * 4 + 2];
                              local_1d8 = local_1d8 + (ulong)(uint)(iVar101 * iVar101);
                              uVar39 = uVar39 + 1;
                            } while (local_1a8 != uVar39);
                          }
                          uVar32 = CONCAT71((int7)((ulong)local_1e8 >> 8),1);
                          bVar21 = true;
                          pSelectors = local_140;
                          puVar46 = local_210;
                          lVar47 = local_1c8._0_8_;
                          __n = local_1a8;
                        }
                      }
                      bVar52 = iVar23 < 0;
                      iVar23 = iVar23 + 2;
                    } while (bVar52);
                    lVar29 = 1;
                    local_1f8 = local_1b8 + 1;
                    uVar44 = local_21c & 1;
                    local_21c = 0;
                  } while (uVar44 != 0);
                }
                high16 = local_218;
                n = (uint)uVar27;
                lVar47 = lVar47 + 1;
                pcVar42 = (color_quad_u8 *)((long)&pcVar42->field_0 + 1);
              } while (lVar47 != 3);
              if (!bVar21) {
                if ((local_134 & 1) == 0) {
                  if ((local_21d & local_1ec < 3) == 0) {
                    uVar50 = *local_218;
                    goto LAB_001759fc;
                  }
                  uVar51 = *local_228;
                  goto LAB_001759db;
                }
                break;
              }
              uVar32 = CONCAT71((int7)((ulong)uVar32 >> 8),1);
              uVar36 = 0;
            } while (((uint)local_204 & 1) != 0);
            uVar51 = *local_228;
            uVar50 = *local_218;
            uVar33 = determine_error(n,block,uVar51,uVar50,0xffffffffffffffff);
            if ((uVar33 == 0) || (2 < local_1ec)) break;
LAB_001759db:
            local_1ec = local_1ec + 1;
          } while( true );
        }
      }
    }
    else {
      memset(pSelectors,2,local_1a8);
      *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2] |
               (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2] << 5 |
               (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2] << 0xb;
      n = (uint)local_1d0;
      uVar50 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2 + 1] |
               (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2 + 1] << 5 |
               (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2 + 1] << 0xb;
      *high16 = uVar50;
      local_228 = low16;
    }
  }
LAB_001759fc:
  uVar44 = *local_228;
  if (uVar44 < uVar50) {
    *local_228 = uVar50;
    *high16 = uVar44;
    if (n != 0) {
      uVar27 = 0;
      do {
        pSelectors[uVar27] = pSelectors[uVar27] ^ 1;
        uVar27 = uVar27 + 1;
      } while (__n != uVar27);
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine)
        {
            CRNLIB_ASSERT((n & 15) == 0);

            uint ave_color[3];
            float axis[3];

            if (!optimize_block_colors(n, block, low16, high16, ave_color, axis))
            {
                compress_solid_block(n, ave_color, low16, high16, pSelectors);
            }
            else
            {
                if (!determine_selectors(n, block, low16, high16, pSelectors))
                {
                    compress_solid_block(n, ave_color, low16, high16, pSelectors);
                }
                else
                {
                    if (refine_block(n, block, low16, high16, pSelectors))
                    {
                        determine_selectors(n, block, low16, high16, pSelectors);
                    }

                    if (refine)
                    {
                        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
                    }
                }
            }

            if (low16 < high16)
            {
                std::swap(low16, high16);
                for (uint i = 0; i < n; i++)
                {
                    pSelectors[i] ^= 1;
                }
            }
        }